

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_compileData *
MOJOSHADER_compile(char *srcprofile,char *filename,char *source,uint sourcelen,
                  MOJOSHADER_preprocessorDefine *defs,uint define_count,
                  MOJOSHADER_includeOpen include_open,MOJOSHADER_includeClose include_close,
                  MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  size_t __n;
  MOJOSHADER_astNodeType MVar1;
  int iVar2;
  MOJOSHADER_astNode *pMVar3;
  bool bVar4;
  FILE *io;
  int iVar5;
  Context_conflict *ctx;
  MOJOSHADER_irStatement **__s;
  MOJOSHADER_irStatement *pMVar6;
  MOJOSHADER_irStatement *pMVar7;
  MOJOSHADER_compileData *_data;
  MOJOSHADER_error *pMVar8;
  MOJOSHADER_free p_Var9;
  ulong uVar10;
  
  if (m == (MOJOSHADER_malloc)0x0 && f != (MOJOSHADER_free)0x0) {
    return &MOJOSHADER_out_of_mem_compile_data;
  }
  if (m != (MOJOSHADER_malloc)0x0 && f == (MOJOSHADER_free)0x0) {
    return &MOJOSHADER_out_of_mem_compile_data;
  }
  ctx = build_context(m,f,d);
  if (ctx == (Context_conflict *)0x0) {
    return &MOJOSHADER_out_of_mem_compile_data;
  }
  choose_src_profile(ctx,srcprofile);
  if (ctx->isfail == 0) {
    parse_source(ctx,filename,source,sourcelen,defs,define_count,include_open,include_close);
  }
  if (ctx->isfail == 0) {
    type_check_ast(ctx,ctx->ast);
  }
  if (ctx->isfail == 0) {
    __n = (long)ctx->user_func_index * 8 + 8;
    __s = (MOJOSHADER_irStatement **)(*ctx->malloc)((int)__n,ctx->malloc_data);
    if (__s == (MOJOSHADER_irStatement **)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
    }
    ctx->ir = __s;
    if (__s != (MOJOSHADER_irStatement **)0x0) {
      memset(__s,0,__n);
      ctx->ir_end = -1;
      ctx->ir_ret = -1;
      io = _stdout;
      for (pMVar3 = ctx->ast; _stdout = io, pMVar3 != (MOJOSHADER_astNode *)0x0;
          pMVar3 = (MOJOSHADER_astNode *)(pMVar3->expression).datatype) {
        MVar1 = (pMVar3->ast).type;
        if (MVar1 < MOJOSHADER_AST_COMPUNIT_FUNCTION) {
          __assert_fail("ast->ast.type > MOJOSHADER_AST_COMPUNIT_START_RANGE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x172d,"void intermediate_representation(Context *)");
        }
        if (MOJOSHADER_AST_COMPUNIT_VARIABLE < MVar1) {
          __assert_fail("ast->ast.type < MOJOSHADER_AST_COMPUNIT_END_RANGE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x172e,"void intermediate_representation(Context *)");
        }
        if ((MVar1 == MOJOSHADER_AST_COMPUNIT_FUNCTION) &&
           ((pMVar3->binary).right != (MOJOSHADER_astExpression *)0x0)) {
          if (ctx->ir_loop != (LoopLabels *)0x0) {
            __assert_fail("ctx->ir_loop == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x1736,"void intermediate_representation(Context *)");
          }
          if (-1 < ctx->ir_end) {
            __assert_fail("ctx->ir_end < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x1737,"void intermediate_representation(Context *)");
          }
          if (-1 < ctx->ir_ret) {
            __assert_fail("ctx->ir_ret < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x1738,"void intermediate_representation(Context *)");
          }
          iVar5 = ctx->ir_label_count;
          ctx->ir_label_count = iVar5 + 2;
          ctx->ir_end = iVar5 + 1;
          if (((pMVar3->arguments).next)->argument != (MOJOSHADER_astExpression *)0x0) {
            iVar2 = ctx->ir_temp_count;
            ctx->ir_temp_count = iVar2 + 1;
            ctx->ir_ret = iVar2;
          }
          pMVar6 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
          if (pMVar6 == (MOJOSHADER_irStatement *)0x0) {
            ctx->isfail = 1;
            ctx->out_of_memory = 1;
            pMVar6 = (MOJOSHADER_irStatement *)0x0;
          }
          else {
            (pMVar6->ir).type = MOJOSHADER_IR_LABEL;
            (pMVar6->ir).filename = ctx->sourcefile;
            (pMVar6->ir).line = ctx->sourceline;
            (pMVar6->jump).label = iVar5;
          }
          pMVar7 = (MOJOSHADER_irStatement *)build_ir_internal(ctx,(pMVar3->binary).right);
          if (pMVar7 != (MOJOSHADER_irStatement *)0x0) {
            if ((pMVar7->ir).type < MOJOSHADER_IR_MOVE) {
              __assert_fail("!retval || (retval->ir.type > MOJOSHADER_IR_START_RANGE_STMT)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                            ,0x11f4,"MOJOSHADER_irStatement *build_ir_stmt(Context *, void *)");
            }
            if (MOJOSHADER_IR_DISCARD < (pMVar7->ir).type) {
              __assert_fail("!retval || (retval->ir.type < MOJOSHADER_IR_END_RANGE_STMT)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                            ,0x11f5,"MOJOSHADER_irStatement *build_ir_stmt(Context *, void *)");
            }
          }
          pMVar6 = new_ir_seq(ctx,pMVar6,pMVar7);
          pMVar7 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
          if (pMVar7 == (MOJOSHADER_irStatement *)0x0) {
            ctx->isfail = 1;
            ctx->out_of_memory = 1;
            pMVar7 = (MOJOSHADER_irStatement *)0x0;
          }
          else {
            (pMVar7->ir).type = MOJOSHADER_IR_LABEL;
            (pMVar7->ir).filename = ctx->sourcefile;
            (pMVar7->ir).line = ctx->sourceline;
            (pMVar7->jump).label = iVar5 + 1;
          }
          pMVar6 = new_ir_seq(ctx,pMVar6,pMVar7);
          if (ctx->ir_loop != (LoopLabels *)0x0) {
            __assert_fail("ctx->ir_loop == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x1742,"void intermediate_representation(Context *)");
          }
          ctx->ir_end = -1;
          ctx->ir_ret = -1;
          iVar5 = (pMVar3->derefstruct).isswizzle;
          if (ctx->user_func_index < iVar5) {
            __assert_fail("astfn->index <= ctx->user_func_index",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x1746,"void intermediate_representation(Context *)");
          }
          if (ctx->ir[iVar5] != (MOJOSHADER_irStatement *)0x0) {
            __assert_fail("ctx->ir[astfn->index] == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x1747,"void intermediate_representation(Context *)");
          }
          ctx->ir[iVar5] = pMVar6;
        }
        io = _stdout;
      }
      if ((ctx->ir != (MOJOSHADER_irStatement **)0x0) && (-1 < ctx->user_func_index)) {
        uVar10 = 0;
        do {
          printf("[FUNCTION %d ]\n",uVar10 & 0xffffffff);
          print_ir(io,1,ctx->ir[uVar10]);
          bVar4 = (long)uVar10 < (long)ctx->user_func_index;
          uVar10 = uVar10 + 1;
        } while (bVar4);
      }
      delete_compilation_unit(ctx,&ctx->ast->compunit);
      ctx->ast = (MOJOSHADER_astNode *)0x0;
    }
  }
  _data = (MOJOSHADER_compileData *)(*ctx->malloc)(0x58,ctx->malloc_data);
  if (_data == (MOJOSHADER_compileData *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    _data->malloc = (MOJOSHADER_malloc)0x0;
    _data->free = (MOJOSHADER_free)0x0;
    _data->output_len = 0;
    _data->symbol_count = 0;
    _data->symbols = (MOJOSHADER_symbol *)0x0;
    _data->source_profile = (char *)0x0;
    _data->output = (char *)0x0;
    *(undefined8 *)&_data->warning_count = 0;
    _data->warnings = (MOJOSHADER_error *)0x0;
    *(undefined8 *)_data = 0;
    _data->errors = (MOJOSHADER_error *)0x0;
    _data->malloc_data = (void *)0x0;
    p_Var9 = (MOJOSHADER_free)ctx->malloc;
    if (ctx->malloc == MOJOSHADER_internal_malloc) {
      p_Var9 = (MOJOSHADER_free)0x0;
    }
    _data->malloc = (MOJOSHADER_malloc)p_Var9;
    p_Var9 = ctx->free;
    if (ctx->free == MOJOSHADER_internal_free) {
      p_Var9 = (MOJOSHADER_free)0x0;
    }
    _data->free = p_Var9;
    _data->malloc_data = ctx->malloc_data;
    _data->source_profile = ctx->source_profile;
    iVar5 = errorlist_count(ctx->errors);
    _data->error_count = iVar5;
    pMVar8 = errorlist_flatten(ctx->errors);
    _data->errors = pMVar8;
    iVar5 = errorlist_count(ctx->warnings);
    _data->warning_count = iVar5;
    pMVar8 = errorlist_flatten(ctx->warnings);
    _data->warnings = pMVar8;
    if (ctx->out_of_memory == 0) goto LAB_00125292;
    MOJOSHADER_freeCompileData(_data);
  }
  _data = &MOJOSHADER_out_of_mem_compile_data;
LAB_00125292:
  destroy_context(ctx);
  return _data;
}

Assistant:

const MOJOSHADER_compileData *MOJOSHADER_compile(const char *srcprofile,
                                    const char *filename, const char *source,
                                    unsigned int sourcelen,
                                    const MOJOSHADER_preprocessorDefine *defs,
                                    unsigned int define_count,
                                    MOJOSHADER_includeOpen include_open,
                                    MOJOSHADER_includeClose include_close,
                                    MOJOSHADER_malloc m, MOJOSHADER_free f,
                                    void *d)
{
    // !!! FIXME: cut and paste from MOJOSHADER_parseAst().
    MOJOSHADER_compileData *retval = NULL;
    Context *ctx = NULL;

    if ( ((m == NULL) && (f != NULL)) || ((m != NULL) && (f == NULL)) )
        return &MOJOSHADER_out_of_mem_compile_data;  // supply both or neither.

    ctx = build_context(m, f, d);
    if (ctx == NULL)
        return &MOJOSHADER_out_of_mem_compile_data;

    choose_src_profile(ctx, srcprofile);

    if (!isfail(ctx))
    {
        parse_source(ctx, filename, source, sourcelen, defs, define_count,
                     include_open, include_close);
    } // if

    if (!isfail(ctx))
        semantic_analysis(ctx);

    if (!isfail(ctx))
        intermediate_representation(ctx);

    if (isfail(ctx))
        retval = (MOJOSHADER_compileData *) build_failed_compile(ctx);
    else
        retval = (MOJOSHADER_compileData *) build_compiledata(ctx);

    destroy_context(ctx);
    return retval;
}